

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcodeparse.y
# Opt level: O3

void __thiscall PcodeSnippet::~PcodeSnippet(PcodeSnippet *this)

{
  ConstructTpl *this_00;
  pointer pcVar1;
  _Rb_tree_node_base *p_Var2;
  
  (this->super_PcodeCompile)._vptr_PcodeCompile = (_func_int **)&PTR_allocateTemp_003ce790;
  for (p_Var2 = (this->tree)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->tree)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    if (*(long **)(p_Var2 + 1) != (long *)0x0) {
      (**(code **)(**(long **)(p_Var2 + 1) + 8))();
    }
  }
  this_00 = this->result;
  if (this_00 != (ConstructTpl *)0x0) {
    ConstructTpl::~ConstructTpl(this_00);
    operator_delete(this_00);
    this->result = (ConstructTpl *)0x0;
  }
  pcVar1 = (this->firsterror)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->firsterror).field_2) {
    operator_delete(pcVar1);
  }
  std::
  _Rb_tree<SleighSymbol_*,_SleighSymbol_*,_std::_Identity<SleighSymbol_*>,_SymbolCompare,_std::allocator<SleighSymbol_*>_>
  ::~_Rb_tree(&(this->tree)._M_t);
  pcVar1 = (this->lexer).curidentifier._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 == &(this->lexer).curidentifier.field_2) {
    return;
  }
  operator_delete(pcVar1);
  return;
}

Assistant:

PcodeSnippet::~PcodeSnippet(void)

{
  SymbolTree::iterator iter;
  for(iter=tree.begin();iter!=tree.end();++iter)
    delete *iter;		// Free ALL temporary symbols
  if (result != (ConstructTpl *)0) {
    delete result;
    result = (ConstructTpl *)0;
  }
}